

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_unittests.cpp
# Opt level: O1

void __thiscall Matrix_Sub_Test::TestBody(Matrix_Sub_Test *this)

{
  int *piVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  Matrix<int> s;
  Matrix<int> c;
  Matrix<int> m;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertHelper local_50;
  internal local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  Matrix<int> local_38;
  Matrix<int> local_28;
  Matrix<int> local_18;
  
  Matrix<int>::Matrix(&local_18,2,2);
  piVar1 = *local_18.M;
  piVar1[0] = 1;
  piVar1[1] = 2;
  piVar1 = local_18.M[1];
  piVar1[0] = 3;
  piVar1[1] = 4;
  Matrix<int>::Matrix(&local_28,&local_18);
  Matrix<int>::operator-(&local_38,&local_18);
  local_58.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)local_38.n;
  local_50.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_48,"s.get_rows()","2",(unsigned_long *)&local_58,(int *)&local_50);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
               ,0x4f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
      local_58.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_58.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)local_38.m
    ;
    local_50.data_._0_4_ = 2;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              (local_48,"s.get_columns()","2",(unsigned_long *)&local_58,(int *)&local_50);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                 ,0x50,pcVar3);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_58.ptr_ + 8))();
        }
        local_58.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_58.ptr_ = local_58.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,int>(local_48,"s[0][0]","0",*local_38.M,(int *)&local_58);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_58);
        if (local_40.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                   ,0x51,pcVar3);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_58.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_58.ptr_ + 8))();
          }
          local_58.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_58.ptr_ = local_58.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,int>
                (local_48,"s[0][1]","0",*local_38.M + 1,(int *)&local_58);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_58);
        if (local_40.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                   ,0x52,pcVar3);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_58.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_58.ptr_ + 8))();
          }
          local_58.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_58.ptr_ = local_58.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,int>(local_48,"s[1][0]","0",local_38.M[1],(int *)&local_58)
      ;
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_58);
        if (local_40.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                   ,0x53,pcVar3);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_58.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_58.ptr_ + 8))();
          }
          local_58.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_58.ptr_ = local_58.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,int>
                (local_48,"s[1][1]","0",local_38.M[1] + 1,(int *)&local_58);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_58);
        if (local_40.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                   ,0x54,pcVar3);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_58.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_58.ptr_ + 8))();
          }
          local_58.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  Matrix<int>::~Matrix(&local_38);
  Matrix<int>::~Matrix(&local_28);
  Matrix<int>::~Matrix(&local_18);
  return;
}

Assistant:

TEST(Matrix, Sub) {
  Matrix<int> m(2, 2);
  m[0][0] = 1;
  m[0][1] = 2;
  m[1][0] = 3;
  m[1][1] = 4;

  auto c = m;
  auto s = m - c;

  ASSERT_EQ(s.get_rows(), 2);
  ASSERT_EQ(s.get_columns(), 2);
  EXPECT_EQ(s[0][0], 0);
  EXPECT_EQ(s[0][1], 0);
  EXPECT_EQ(s[1][0], 0);
  EXPECT_EQ(s[1][1], 0);
}